

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

cl_int __thiscall
CLIntercept::autoPartitionGetDeviceIDs
          (CLIntercept *this,cl_platform_id platform,cl_device_type device_type,cl_uint num_entries,
          cl_device_id *devices,cl_uint *num_devices)

{
  cl_int cVar1;
  pointer pp_Var2;
  byte bVar3;
  mapped_type *this_00;
  pointer pp_Var4;
  ulong uVar5;
  pointer pp_Var6;
  uint uVar7;
  ulong uVar8;
  pointer __x;
  pointer pp_Var9;
  float extraout_XMM0_Da;
  float __x_00;
  float extraout_XMM0_Da_00;
  float __x_01;
  float extraout_XMM0_Da_01;
  float __x_02;
  cl_uint numSubDevices;
  _cl_device_id *parent;
  cl_int local_d4;
  cl_uint numDevices;
  cl_uint local_cc;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> returnedDevices;
  cl_device_partition_property props [3];
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> parentDevices;
  string deviceInfo;
  
  local_cc = num_entries;
  std::mutex::lock(&this->m_Mutex);
  parentDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parentDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parentDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  returnedDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  returnedDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  returnedDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  numDevices = 0;
  local_d4 = (*(this->m_Dispatch).clGetDeviceIDs)
                       (platform,device_type,0,(cl_device_id *)0x0,&numDevices);
  if (numDevices != 0 && local_d4 == 0) {
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
              (&parentDevices,(ulong)numDevices);
    local_d4 = (*(this->m_Dispatch).clGetDeviceIDs)
                         (platform,device_type,numDevices,
                          parentDevices.
                          super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
  }
  pp_Var2 = parentDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pp_Var9 = parentDevices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    cVar1 = local_d4;
    if (pp_Var9 == pp_Var2) {
      if (local_d4 == 0) {
        uVar5 = (long)returnedDevices.
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)returnedDevices.
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        for (uVar7 = 0; uVar8 = (ulong)uVar7, uVar8 < uVar5; uVar7 = uVar7 + 1) {
          if (uVar7 < local_cc) {
            devices[uVar8] =
                 returnedDevices.
                 super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
          }
        }
        if (num_devices != (cl_uint *)0x0) {
          *num_devices = (cl_uint)uVar5;
        }
      }
      std::_Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~_Vector_base
                (&returnedDevices.
                  super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>);
      std::_Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~_Vector_base
                (&parentDevices.
                  super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>);
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
      return cVar1;
    }
    parent = *pp_Var9;
    this_00 = std::
              map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
              ::operator[](&this->m_SubDeviceCacheMap,&parent);
    pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pp_Var6 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (pp_Var4 == pp_Var6) {
      deviceInfo._M_dataplus._M_p = (pointer)&deviceInfo.field_2;
      deviceInfo._M_string_length = 0;
      deviceInfo.field_2._M_local_buf[0] = '\0';
      getDeviceInfoString(this,1,&parent,&deviceInfo);
      pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pp_Var6 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      __x_02 = extraout_XMM0_Da;
      if (pp_Var6 == pp_Var4) {
        if ((this->m_Config).AutoPartitionByAffinityDomain == true) {
          props[0] = 0x1088;
          props[1] = 0x20;
          props[2] = 0;
          numSubDevices = 0;
          (*(this->m_Dispatch).clCreateSubDevices)
                    (parent,props,0,(cl_device_id *)0x0,&numSubDevices);
          __x_02 = __x_00;
          if (1 < numSubDevices) {
            logf(this,__x_00);
            std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                      (this_00,(ulong)numSubDevices);
            (*(this->m_Dispatch).clCreateSubDevices)
                      (parent,props,numSubDevices,
                       (this_00->
                       super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                       _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
            __x_02 = extraout_XMM0_Da_00;
          }
          pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          pp_Var6 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_0016015f;
        }
LAB_00160168:
        uVar5 = (ulong)(this->m_Config).AutoPartitionEqually;
        if (uVar5 != 0) {
          props[0] = 0x1086;
          props[2] = 0;
          numSubDevices = 0;
          props[1] = uVar5;
          (*(this->m_Dispatch).clCreateSubDevices)
                    (parent,props,0,(cl_device_id *)0x0,&numSubDevices);
          __x_02 = __x_01;
          if (1 < numSubDevices) {
            logf(this,__x_01);
            std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                      (this_00,(ulong)numSubDevices);
            (*(this->m_Dispatch).clCreateSubDevices)
                      (parent,props,numSubDevices,
                       (this_00->
                       super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                       _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
            __x_02 = extraout_XMM0_Da_01;
          }
          pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          pp_Var6 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_0016021a;
        }
LAB_0016021f:
        logf(this,__x_02);
      }
      else {
LAB_0016015f:
        if (pp_Var6 == pp_Var4) goto LAB_00160168;
LAB_0016021a:
        if (pp_Var6 == pp_Var4) goto LAB_0016021f;
      }
      std::__cxx11::string::~string((string *)&deviceInfo);
      pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pp_Var6 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    __x = &parent;
    if (pp_Var6 == pp_Var4) {
LAB_001602ac:
      std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::push_back
                (&returnedDevices,__x);
    }
    else {
      bVar3 = (this->m_Config).AutoPartitionAllDevices;
      if ((bool)bVar3 == true) {
        std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::push_back
                  (&returnedDevices,&parent);
        bVar3 = (this->m_Config).AutoPartitionAllDevices;
      }
      if (((bVar3 & 1) == 0) && ((this->m_Config).AutoPartitionAllSubDevices != true)) {
        if ((this->m_Config).AutoPartitionSingleSubDevice != false) {
          __x = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
        }
        goto LAB_001602ac;
      }
      std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
      insert<__gnu_cxx::__normal_iterator<_cl_device_id**,std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>>,void>
                ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&returnedDevices,
                 (const_iterator)
                 returnedDevices.
                 super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
                  )(this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
                  )(this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
    }
    pp_Var9 = pp_Var9 + 1;
  } while( true );
}

Assistant:

cl_int CLIntercept::autoPartitionGetDeviceIDs(
    cl_platform_id platform,
    cl_device_type device_type,
    cl_uint num_entries,
    cl_device_id* devices,
    cl_uint* num_devices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices ||
                config().AutoPartitionSingleSubDevice );

    cl_int  errorCode = CL_SUCCESS;
    std::vector<cl_device_id>   parentDevices;
    std::vector<cl_device_id>   returnedDevices;

    cl_uint numDevices = 0;
    errorCode = dispatch().clGetDeviceIDs(
        platform,
        device_type,
        0,
        NULL,
        &numDevices );
    if( errorCode == CL_SUCCESS && numDevices != 0 )
    {
        parentDevices.resize(numDevices);
        errorCode = dispatch().clGetDeviceIDs(
            platform,
            device_type,
            numDevices,
            parentDevices.data(),
            NULL );
    }

    for( auto parent : parentDevices )
    {
        std::vector<cl_device_id>&  subDevices = m_SubDeviceCacheMap[parent];

        if( subDevices.empty() )
        {
            std::string deviceInfo;
            getDeviceInfoString(
                1,
                &parent,
                deviceInfo );

            if( subDevices.size() == 0 &&
                config().AutoPartitionByAffinityDomain )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_BY_AFFINITY_DOMAIN,
                    CL_DEVICE_AFFINITY_DOMAIN_NEXT_PARTITIONABLE,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s by affinity domain into %u sub-devices.\n",
                        deviceInfo.c_str(),
                        numSubDevices );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 &&
                config().AutoPartitionEqually )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_EQUALLY,
                    (cl_device_partition_property)config().AutoPartitionEqually,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s equally into %u sub-devices with %u compute unit%s.\n",
                        deviceInfo.c_str(),
                        numSubDevices,
                        config().AutoPartitionEqually,
                        config().AutoPartitionEqually > 1 ? "s" : "" );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 )
            {
                logf("Couldn't partition device %s.\n",
                    deviceInfo.c_str() );
            }
        }

        if( subDevices.size() == 0 )
        {
            returnedDevices.push_back(parent);
        }
        else
        {
            if( config().AutoPartitionAllDevices )
            {
                returnedDevices.push_back(parent);
            }
            if( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices )
            {
                returnedDevices.insert(
                    returnedDevices.end(),
                    subDevices.begin(),
                    subDevices.end() );
            }
            else if( config().AutoPartitionSingleSubDevice )
            {
                returnedDevices.push_back( subDevices.front() );
            }
            else
            {
                CLI_ASSERT( 0 );
                returnedDevices.push_back( parent );
            }
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint d = 0; d < returnedDevices.size(); d++ )
        {
            if( d < num_entries )
            {
                devices[d] = returnedDevices[d];
            }
        }

        if( num_devices )
        {
            num_devices[0] = (cl_uint)returnedDevices.size();
        }
    }

    return errorCode;
}